

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O3

bool __thiscall
siamese::DecoderPacketWindow::GrowWindow(DecoderPacketWindow *this,uint windowElementEnd)

{
  uint uVar1;
  bool bVar2;
  DecoderSubwindow *__s;
  long lVar3;
  uint elements;
  uint i;
  ulong uVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  
  uVar1 = (this->Subwindows).Size;
  uVar4 = (ulong)uVar1;
  elements = windowElementEnd + 0x47 >> 6;
  if (uVar1 < elements) {
    bVar2 = pktalloc::LightVector<siamese::DecoderSubwindow_*,_25U>::SetSize_Copy
                      (&this->Subwindows,elements);
    if (!bVar2) {
      return false;
    }
    do {
      __s = (DecoderSubwindow *)pktalloc::Allocator::Allocate(this->TheAllocator,0x610);
      if (__s == (DecoderSubwindow *)0x0) {
        return false;
      }
      memset(__s,0,0x610);
      auVar5 = vpmovzxbq_avx512f(ZEXT816(0xa890786048301800));
      auVar6 = vpbroadcastq_avx512f(ZEXT816(0xc0));
      lVar3 = 0x40;
      auVar7 = vpbroadcastq_avx512f();
      do {
        auVar8 = vpaddq_avx512f(auVar7,auVar5);
        lVar3 = lVar3 + -8;
        vpscatterqq_avx512f(ZEXT864(__s) + auVar5,0xffff,ZEXT1664((undefined1  [16])0x0));
        auVar5 = vpaddq_avx512f(auVar5,auVar6);
        auVar9 = auVar8._0_32_;
        auVar10 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        vpscatterqd_avx512f(ZEXT832(8) + auVar9,0xffff,auVar10);
        vpscatterqd_avx512f(ZEXT832(0x10) + auVar9,0xffff,auVar10);
        vpscatterqd_avx512f(ZEXT832(0x14) + auVar9,0xffff,auVar10);
      } while (lVar3 != 0);
      (__s->Got).Words[0] = 0;
      __s->GotCount = 0;
      (this->Subwindows).DataPtr[uVar4] = __s;
      uVar4 = uVar4 + 1;
    } while ((uint)uVar4 < elements);
  }
  if (this->Count < windowElementEnd) {
    this->Count = windowElementEnd;
  }
  return true;
}

Assistant:

bool DecoderPacketWindow::GrowWindow(const unsigned windowElementEnd)
{
    // Note: Adding a buffer of lane count to create space ahead for snapshots
    // as a subwindow is filled and we need to store its snapshot
    const unsigned subwindowCount   = Subwindows.GetSize();
    const unsigned subwindowsNeeded = (windowElementEnd + kColumnLaneCount + kSubwindowSize - 1) / kSubwindowSize;

    if (subwindowsNeeded > subwindowCount)
    {
        // Note resizing larger will keep old data in the vector
        if (!Subwindows.SetSize_Copy(subwindowsNeeded))
            return false;

        // For each subwindow to initialize:
        for (unsigned i = subwindowCount; i < subwindowsNeeded; ++i)
        {
            DecoderSubwindow* subwindow = TheAllocator->Construct<DecoderSubwindow>();
            if (!subwindow)
                return false; // Out of memory

            Subwindows.GetRef(i) = subwindow;
        }
    }

    // If this element expands the window:
    if (windowElementEnd > Count)
        Count = windowElementEnd;

    return true;
}